

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathFunction xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri)

{
  byte bVar1;
  int iVar2;
  xmlXPathFunction p_Var3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  
  if (name != (xmlChar *)0x0 && ctxt != (xmlXPathContextPtr)0x0) {
    if (ns_uri == (xmlChar *)0x0) {
      bVar1 = *name;
      if (bVar1 == 0) {
        uVar6 = 5;
      }
      else {
        pbVar5 = name + 1;
        uVar6 = 0x1505;
        do {
          uVar6 = (uint)bVar1 + uVar6 * 0x21;
          bVar1 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        } while (bVar1 != 0);
        uVar6 = uVar6 & 0x3f;
      }
      bVar1 = xmlXPathSFHash[uVar6];
      while (bVar1 != 0xff) {
        iVar2 = strcmp(xmlXPathStandardFunctions[bVar1].name,(char *)name);
        if (iVar2 == 0) {
          return xmlXPathStandardFunctions[bVar1].func;
        }
        uVar4 = uVar6 + 1;
        if (0x3e < (int)uVar6) {
          uVar4 = 0;
        }
        uVar6 = uVar4;
        bVar1 = xmlXPathSFHash[(int)uVar4];
      }
    }
    if ((ctxt->funcLookupFunc != (xmlXPathFuncLookupFunc)0x0) &&
       (p_Var3 = (*ctxt->funcLookupFunc)(ctxt->funcLookupData,name,ns_uri),
       p_Var3 != (xmlXPathFunction)0x0)) {
      return p_Var3;
    }
    if (ctxt->funcHash != (xmlHashTablePtr)0x0) {
      p_Var3 = (xmlXPathFunction)xmlHashLookup2(ctxt->funcHash,name,ns_uri);
      return p_Var3;
    }
  }
  return (xmlXPathFunction)0x0;
}

Assistant:

xmlXPathFunction
xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt, const xmlChar *name,
			 const xmlChar *ns_uri) {
    xmlXPathFunction ret;
    void *payload;

    if (ctxt == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);

    if (ns_uri == NULL) {
        int bucketIndex = xmlXPathSFComputeHash(name) % SF_HASH_SIZE;

        while (xmlXPathSFHash[bucketIndex] != UCHAR_MAX) {
            int funcIndex = xmlXPathSFHash[bucketIndex];

            if (strcmp(xmlXPathStandardFunctions[funcIndex].name,
                       (char *) name) == 0)
                return(xmlXPathStandardFunctions[funcIndex].func);

            bucketIndex += 1;
            if (bucketIndex >= SF_HASH_SIZE)
                bucketIndex = 0;
        }
    }

    if (ctxt->funcLookupFunc != NULL) {
	xmlXPathFuncLookupFunc f;

	f = ctxt->funcLookupFunc;
	ret = f(ctxt->funcLookupData, name, ns_uri);
	if (ret != NULL)
	    return(ret);
    }

    if (ctxt->funcHash == NULL)
	return(NULL);

    payload = xmlHashLookup2(ctxt->funcHash, name, ns_uri);
    memcpy(&ret, &payload, sizeof(payload));

    return(ret);
}